

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_node_atomize(lys_node *node,lyxp_set *set,int set_ext_dep_flags)

{
  ushort *puVar1;
  uint16_t flags2;
  LYS_NODE LVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  undefined7 uVar10;
  lys_node *plVar6;
  char *__ptr;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_node *node_00;
  lys_node *plVar9;
  ulong uVar11;
  ly_ctx *ctx;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auStack_c8 [8];
  lyxp_set tmp_set;
  lys_node *local_60;
  lys_node *ctx_snode;
  uint local_50;
  int local_4c;
  char *local_48;
  ulong local_40;
  lys_node *local_38;
  
  local_60 = (lys_node *)0x0;
  tmp_set.ht = (hash_table *)0x0;
  tmp_set.ctx_pos = 0;
  tmp_set.ctx_size = 0;
  tmp_set.val._8_8_ = 0;
  tmp_set.used = 0;
  tmp_set.size = 0;
  tmp_set._8_8_ = 0;
  tmp_set.val.nodes = (lyxp_set_node *)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  tmp_set.type = LYXP_SET_EMPTY;
  tmp_set._4_4_ = 0;
  set->ctx_pos = 0;
  set->ctx_size = 0;
  *(undefined8 *)&set->field_0x38 = 0;
  set->used = 0;
  set->size = 0;
  set->ht = (hash_table *)0x0;
  (set->val).nodes = (lyxp_set_node *)0x0;
  *(undefined8 *)((long)&set->val + 8) = 0;
  *(undefined8 *)set = 0;
  *(undefined8 *)&set->field_0x8 = 0;
  uVar14 = 0x20;
  local_4c = set_ext_dep_flags;
  local_38 = node;
  for (; node != (lys_node *)0x0; node = lys_parent(node)) {
    if (node->nodetype == LYS_OUTPUT) goto LAB_0016ff8d;
  }
  uVar14 = 0;
LAB_0016ff8d:
  LVar2 = local_38->nodetype;
  plVar9 = (lys_node *)0x0;
  local_40 = 0;
  uVar10 = (undefined7)((ulong)local_38 >> 8);
  local_48 = (char *)0x0;
  switch(LVar2) {
  case LYS_CONTAINER:
    plVar9 = (lys_node *)local_38[1].name;
    local_48 = local_38[1].dsc;
    local_40 = CONCAT71(uVar10,local_38->padding[1]);
    break;
  case LYS_CHOICE:
switchD_00170010_caseD_2:
    plVar9 = *(lys_node **)local_38->hash;
LAB_00170071:
    local_40 = 0;
    local_48 = (char *)0x0;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    break;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_00170010_caseD_4:
    plVar9 = (lys_node *)local_38[1].name;
    local_48 = local_38[1].dsc;
    local_40 = CONCAT71(uVar10,local_38->padding[3]);
    break;
  default:
    if (LVar2 == LYS_LIST) {
      plVar9 = (lys_node *)local_38[1].name;
      local_48 = local_38[1].dsc;
      local_40 = CONCAT71(uVar10,local_38->padding[0]);
    }
    else {
      if (LVar2 == LYS_ANYXML) goto switchD_00170010_caseD_4;
      if (LVar2 == LYS_CASE) goto switchD_00170010_caseD_2;
      if (LVar2 == LYS_NOTIF) {
        local_48 = local_38[1].dsc;
      }
      else {
        if ((LVar2 != LYS_INPUT) && (LVar2 != LYS_OUTPUT)) {
          if (LVar2 == LYS_USES) goto switchD_00170010_caseD_2;
          if (LVar2 != LYS_AUGMENT) {
            local_48 = (char *)0x0;
            if (LVar2 != LYS_ANYDATA) break;
            goto switchD_00170010_caseD_4;
          }
          plVar9 = local_38->next;
          goto LAB_00170071;
        }
        local_48 = local_38[1].name;
      }
      local_40 = CONCAT71(uVar10,local_38->padding[1]);
      plVar9 = (lys_node *)0x0;
    }
  }
  plVar6 = local_38;
  if (local_4c != 0) {
    for (; plVar6 != (lys_node *)0x0; plVar6 = lys_parent(plVar6)) {
      node = plVar6;
      if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN) goto LAB_001700c2;
    }
    node = (lys_node *)0x0;
  }
LAB_001700c2:
  if (plVar9 != (lys_node *)0x0) {
    iVar5 = lyxp_atomize(plVar9->name,local_38,LYXP_NODE_ELEM,(lyxp_set *)auStack_c8,uVar14 | 0x10,
                         &local_60);
    plVar6 = local_38;
    if (iVar5 != 0) {
      free((void *)tmp_set._8_8_);
      if (local_60 == (lys_node *)0x0) {
        ctx = local_38->module->ctx;
        pcVar13 = plVar9->name;
        pcVar12 = "Invalid when condition \"%s\".";
LAB_00170431:
        __ptr = (char *)0x0;
      }
      else {
        __ptr = lys_path(local_60,1);
        ctx = local_38->module->ctx;
        pcVar13 = plVar9->name;
        pcVar12 = "Invalid when condition \"%s\" with context node \"%s\".";
      }
LAB_00170434:
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,local_38,pcVar12,pcVar13);
      goto LAB_00170441;
    }
    if (local_4c != 0) {
      for (uVar11 = 0; uVar11 < (tmp_set.val._8_8_ & 0xffffffff); uVar11 = uVar11 + 1) {
        lVar15 = uVar11 * 0x10;
        if (*(int *)(tmp_set._8_8_ + 8 + lVar15) == 2) {
          local_50 = (uint)plVar6->flags;
          plVar7 = lys_node_module(plVar6);
          pcVar13 = plVar6->name;
          ctx_snode = (lys_node *)
                      CONCAT44(ctx_snode._4_4_,(uint)(*(lys_node **)(tmp_set._8_8_ + lVar15))->flags
                              );
          plVar8 = lys_node_module(*(lys_node **)(tmp_set._8_8_ + lVar15));
          iVar5 = lyp_check_status((uint16_t)local_50,plVar7,pcVar13,(uint16_t)ctx_snode,plVar8,
                                   (char *)**(undefined8 **)(tmp_set._8_8_ + lVar15),plVar6);
          if (iVar5 != 0) goto LAB_00170417;
          if (node != (lys_node *)0x0) {
            for (node_00 = *(lys_node **)(tmp_set._8_8_ + lVar15);
                (node_00 != (lys_node *)0x0 && (node_00 != node)); node_00 = lys_parent(node_00)) {
            }
            if (node_00 == (lys_node *)0x0) {
              uVar4 = *(ushort *)(*(long *)(tmp_set._8_8_ + lVar15) + 0x18);
              uVar3 = 0x200;
              if (((uVar4 & 1) == 0) && (uVar3 = 0x400, (uVar4 & 2) == 0)) {
                __assert_fail("tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x22cc,
                              "int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)"
                             );
              }
              puVar1 = (ushort *)((long)&plVar9->ext + 2);
              *puVar1 = *puVar1 | uVar3;
              local_38->flags = local_38->flags | uVar3;
            }
          }
        }
      }
    }
    set_snode_merge(set,(lyxp_set *)auStack_c8);
    tmp_set.ht = (hash_table *)0x0;
    tmp_set.ctx_pos = 0;
    tmp_set.ctx_size = 0;
    tmp_set.val._8_8_ = 0;
    tmp_set.used = 0;
    tmp_set.size = 0;
    tmp_set._8_8_ = 0;
    tmp_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    tmp_set.type = LYXP_SET_EMPTY;
    tmp_set._4_4_ = 0;
  }
  tmp_set._60_4_ = uVar14 | 8;
  uVar11 = local_40 & 0xff;
  uVar16 = 0;
  while (uVar16 != uVar11) {
    ctx_snode = (lys_node *)(local_48 + uVar16 * 0x38);
    local_40 = uVar16;
    iVar5 = lyxp_atomize(*(char **)(local_48 + uVar16 * 0x38),local_38,LYXP_NODE_ELEM,
                         (lyxp_set *)auStack_c8,tmp_set._60_4_,&local_60);
    if (iVar5 != 0) {
      free((void *)tmp_set._8_8_);
      if (local_60 == (lys_node *)0x0) {
        ctx = local_38->module->ctx;
        pcVar13 = ctx_snode->name;
        pcVar12 = "Invalid must restriction \"%s\".";
        goto LAB_00170431;
      }
      __ptr = lys_path(local_60,1);
      ctx = local_38->module->ctx;
      pcVar13 = ctx_snode->name;
      pcVar12 = "Invalid must restriction \"%s\" with context node \"%s\".";
      goto LAB_00170434;
    }
    if (local_4c != 0) {
      for (uVar16 = 0; plVar9 = local_38, uVar16 < (tmp_set.val._8_8_ & 0xffffffff);
          uVar16 = uVar16 + 1) {
        lVar15 = uVar16 * 0x10;
        if (*(int *)(tmp_set._8_8_ + 8 + lVar15) == 2) {
          local_50 = (uint)local_38->flags;
          plVar7 = lys_node_module(local_38);
          pcVar13 = plVar9->name;
          flags2 = (*(lys_node **)(tmp_set._8_8_ + lVar15))->flags;
          plVar8 = lys_node_module(*(lys_node **)(tmp_set._8_8_ + lVar15));
          iVar5 = lyp_check_status((uint16_t)local_50,plVar7,pcVar13,flags2,plVar8,
                                   (char *)**(undefined8 **)(tmp_set._8_8_ + lVar15),plVar9);
          if (iVar5 != 0) goto LAB_00170417;
          if (node != (lys_node *)0x0) {
            for (plVar9 = *(lys_node **)(tmp_set._8_8_ + lVar15);
                (plVar9 != (lys_node *)0x0 && (plVar9 != node)); plVar9 = lys_parent(plVar9)) {
            }
            if (plVar9 == (lys_node *)0x0) {
              plVar9 = *(lys_node **)(tmp_set._8_8_ + lVar15);
              uVar4 = 0x200;
              if (((plVar9->flags & 1) == 0) && (uVar4 = 0x400, (plVar9->flags & 2) == 0)) {
                while( true ) {
                  if (plVar9 == (lys_node *)0x0) goto LAB_001704e9;
                  if (plVar9->nodetype == LYS_AUGMENT) break;
                  plVar9 = plVar9->parent;
                }
                plVar7 = lys_node_module(plVar9);
                if ((plVar7->field_0x40 & 0x80) != 0) {
LAB_001704e9:
                  __assert_fail("elem && !lys_node_module(elem)->implemented",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                ,0x2303,
                                "int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)"
                               );
                }
              }
              else {
                puVar1 = (ushort *)((long)&ctx_snode->module + 2);
                *puVar1 = *puVar1 | uVar4;
                local_38->flags = local_38->flags | uVar4;
              }
            }
          }
        }
      }
    }
    set_snode_merge(set,(lyxp_set *)auStack_c8);
    tmp_set.ht = (hash_table *)0x0;
    tmp_set.ctx_pos = 0;
    tmp_set.ctx_size = 0;
    tmp_set.val._8_8_ = 0;
    tmp_set.used = 0;
    tmp_set.size = 0;
    tmp_set._8_8_ = 0;
    tmp_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    tmp_set.type = LYXP_SET_EMPTY;
    tmp_set._4_4_ = 0;
    uVar16 = local_40 + 1;
  }
  __ptr = (char *)0x0;
  iVar5 = 0;
LAB_00170464:
  free(__ptr);
  return iVar5;
LAB_00170417:
  __ptr = (char *)0x0;
LAB_00170441:
  iVar5 = -1;
  free((set->val).nodes);
  set->ctx_pos = 0;
  set->ctx_size = 0;
  *(undefined8 *)&set->field_0x38 = 0;
  set->used = 0;
  set->size = 0;
  set->ht = (hash_table *)0x0;
  (set->val).nodes = (lyxp_set_node *)0x0;
  *(undefined8 *)((long)&set->val + 8) = 0;
  *(undefined8 *)set = 0;
  *(undefined8 *)&set->field_0x8 = 0;
  goto LAB_00170464;
}

Assistant:

int
lyxp_node_atomize(const struct lys_node *node, struct lyxp_set *set, int set_ext_dep_flags)
{
    struct lys_node *parent, *elem;
    const struct lys_node *ctx_snode = NULL;
    struct lyxp_set tmp_set;
    uint8_t must_size = 0;
    uint32_t i, j;
    int opts, ret = EXIT_SUCCESS;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    char *path = NULL;

    memset(&tmp_set, 0, sizeof tmp_set);
    memset(set, 0, sizeof *set);

    /* check if we will be traversing RPC output */
    opts = 0;
    for (parent = (struct lys_node *)node; parent && (parent->nodetype != LYS_OUTPUT); parent = lys_parent(parent));
    if (parent) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    if (set_ext_dep_flags) {
        /* find operation if in one, used later */
        for (parent = (struct lys_node *)node;
             parent && !(parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF));
             parent = lys_parent(parent));
    }

    /* check "when" */
    if (when) {
        if (lyxp_atomize(when->cond, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_WHEN | opts, &ctx_snode)) {
            free(tmp_set.val.snodes);
            if (ctx_snode) {
                path = lys_path(ctx_snode, LYS_PATH_FIRST_PREFIX);
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node,
                       "Invalid when condition \"%s\" with context node \"%s\".", when->cond, path);
            } else {
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
            }
            ret = -1;
            goto finish;
        } else {
            if (set_ext_dep_flags) {
                for (j = 0; j < tmp_set.used; ++j) {
                    /* skip roots'n'stuff */
                    if (tmp_set.val.snodes[j].type == LYXP_NODE_ELEM) {
                        /* XPath expression cannot reference "lower" status than the node that has the definition */
                        if (lyp_check_status(node->flags, lys_node_module(node), node->name, tmp_set.val.snodes[j].snode->flags,
                                lys_node_module(tmp_set.val.snodes[j].snode), tmp_set.val.snodes[j].snode->name, node)) {
                            ret = -1;
                            goto finish;
                        }

                        if (parent) {
                            for (elem = tmp_set.val.snodes[j].snode; elem && (elem != parent); elem = lys_parent(elem));
                            if (!elem) {
                                /* not in node's RPC or notification subtree, set the correct dep flag */
                                if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_W) {
                                    when->flags |= LYS_XPCONF_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPCONF_DEP;
                                } else {
                                    assert(tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R);
                                    when->flags |= LYS_XPSTATE_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPSTATE_DEP;
                                }
                            }
                        }
                    }
                }
            }
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        if (lyxp_atomize(must[i].expr, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_MUST | opts, &ctx_snode)) {
            free(tmp_set.val.snodes);
            if (ctx_snode) {
                path = lys_path(ctx_snode, LYS_PATH_FIRST_PREFIX);
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node,
                       "Invalid must restriction \"%s\" with context node \"%s\".", must[i].expr, path);
            } else {
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
            }
            ret = -1;
            goto finish;
        } else {
            if (set_ext_dep_flags) {
                for (j = 0; j < tmp_set.used; ++j) {
                    /* skip roots'n'stuff */
                    if (tmp_set.val.snodes[j].type == LYXP_NODE_ELEM) {
                        /* XPath expression cannot reference "lower" status than the node that has the definition */
                        if (lyp_check_status(node->flags, lys_node_module(node), node->name, tmp_set.val.snodes[j].snode->flags,
                                lys_node_module(tmp_set.val.snodes[j].snode), tmp_set.val.snodes[j].snode->name, node)) {
                            ret = -1;
                            goto finish;
                        }

                        if (parent) {
                            for (elem = tmp_set.val.snodes[j].snode; elem && (elem != parent); elem = lys_parent(elem));
                            if (!elem) {
                                /* not in node's RPC or notification subtree, set the correct dep flag */
                                if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_W) {
                                    must[i].flags |= LYS_XPCONF_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPCONF_DEP;
                                } else if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R) {
                                    must[i].flags |= LYS_XPSTATE_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPSTATE_DEP;
                                } else {
                                    /* only possible if the node is in an unimplemented augment */
                                    elem = tmp_set.val.snodes[j].snode;
                                    while (elem && (elem->nodetype != LYS_AUGMENT)) {
                                        elem = elem->parent;
                                    }
                                    assert(elem && !lys_node_module(elem)->implemented);
                                }
                            }
                        }
                    }
                }
            }
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

finish:
    if (ret) {
        free(set->val.snodes);
        memset(set, 0, sizeof *set);
    }
    free(path);
    return ret;
}